

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O0

bool __thiscall iDynTree::optimalcontrol::TimeRange::operator==(TimeRange *this,TimeRange *rhs)

{
  uint uVar1;
  TimeRange *in_RSI;
  double *in_RDI;
  byte local_31;
  double local_28;
  double local_20;
  TimeRange *local_18;
  bool local_1;
  
  if ((((ulong)in_RDI[2] & 1) == 0) || ((in_RSI->m_anyTime & 1U) == 0)) {
    if ((in_RSI->m_anyTime & 1U) == 0) {
      if (((ulong)in_RDI[2] & 1) == 0) {
        local_18 = in_RSI;
        local_20 = initTime(in_RSI);
        uVar1 = iDynTree::checkDoublesAreEqual(in_RDI,&local_20,DEFAULT_TOL);
        local_31 = 0;
        if ((uVar1 & 1) != 0) {
          local_28 = endTime(local_18);
          local_31 = iDynTree::checkDoublesAreEqual(in_RDI + 1,&local_28,DEFAULT_TOL);
        }
        local_1 = (bool)(local_31 & 1);
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool TimeRange::operator==(const TimeRange &rhs) const
        {
            if (this->m_anyTime && rhs.m_anyTime) {
                return true;
            }

            if (rhs.m_anyTime) {
                return false;
            }

            if (this ->m_anyTime) {
                return false;
            }

            return (checkDoublesAreEqual(this->m_initTime, rhs.initTime()) && checkDoublesAreEqual(this->m_endTime, rhs.endTime()));//((this->m_initTime == rhs.initTime())&&(this->m_endTime == rhs.endTime()));
        }